

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ostream * operator<<(ostream *stream,Request *req)

{
  bool bVar1;
  ostream *poVar2;
  pointer pHVar3;
  char *pcVar4;
  __normal_iterator<const_httpparser::Request::HeaderItem_*,_std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>_>
  local_28;
  __normal_iterator<const_httpparser::Request::HeaderItem_*,_std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>_>
  local_20;
  const_iterator it;
  Request *req_local;
  ostream *stream_local;
  
  it._M_current = (HeaderItem *)req;
  poVar2 = std::operator<<(stream,(string *)req);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&(it._M_current)->value);
  poVar2 = std::operator<<(poVar2," HTTP/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&it._M_current[1].name);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&it._M_current[1].name.field_0x4);
  std::operator<<(poVar2,"\n");
  local_20._M_current =
       (HeaderItem *)
       std::
       vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
       begin((vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
              *)&it._M_current[1].name._M_string_length);
  while( true ) {
    local_28._M_current =
         (HeaderItem *)
         std::
         vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
         end((vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
              *)&it._M_current[1].name._M_string_length);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pHVar3 = __gnu_cxx::
             __normal_iterator<const_httpparser::Request::HeaderItem_*,_std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>_>
             ::operator->(&local_20);
    poVar2 = std::operator<<(stream,(string *)pHVar3);
    poVar2 = std::operator<<(poVar2,": ");
    pHVar3 = __gnu_cxx::
             __normal_iterator<const_httpparser::Request::HeaderItem_*,_std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>_>
             ::operator->(&local_20);
    poVar2 = std::operator<<(poVar2,(string *)&pHVar3->value);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_httpparser::Request::HeaderItem_*,_std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>_>
    ::operator++(&local_20);
  }
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)&it._M_current[1].value);
  poVar2 = std::operator<<(stream,pcVar4);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(stream,"+ keep-alive: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(bool)(it._M_current[1].value.field_2._M_local_buf[8] & 1));
  std::operator<<(poVar2,"\n");
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream &stream, const httpparser::Request &req)
{
    stream << req.method << " " << req.uri << " HTTP/" 
           << req.versionMajor << "." << req.versionMinor << "\n";
           
    for(std::vector<httpparser::Request::HeaderItem>::const_iterator it = req.headers.begin();
        it != req.headers.end(); ++it)
    {
        stream << it->name << ": " << it->value << "\n";
    }
    
    stream << req.content.data() << "\n";
    stream << "+ keep-alive: " << req.keepAlive << "\n";;
    
    return stream;
}